

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3StrHash(void *pKey,int nKey)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  
  if (nKey < 1) {
    sVar3 = strlen((char *)pKey);
    nKey = (int)sVar3;
    if (nKey < 1) {
      return 0;
    }
  }
  uVar4 = nKey + 1;
  uVar2 = 0;
  do {
    cVar1 = *pKey;
    pKey = (void *)((long)pKey + 1);
    uVar2 = uVar2 * 8 ^ uVar2 ^ (int)cVar1;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  return uVar2 & 0x7fffffff;
}

Assistant:

static int fts3StrHash(const void *pKey, int nKey){
  const char *z = (const char *)pKey;
  unsigned h = 0;
  if( nKey<=0 ) nKey = (int) strlen(z);
  while( nKey > 0  ){
    h = (h<<3) ^ h ^ *z++;
    nKey--;
  }
  return (int)(h & 0x7fffffff);
}